

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsCoreSetLogFile(HelicsCore core,char *logFileName,HelicsError *err)

{
  element_type *peVar1;
  CoreObject *pCVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  
  pCVar2 = helics::getCoreObject(core,err);
  if ((pCVar2 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar2->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , peVar1 != (element_type *)0x0)) {
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (logFileName != (char *)0x0) {
      sVar3 = strlen(logFileName);
      _Var4._M_p = logFileName;
    }
    (*peVar1->_vptr_Core[0x59])(peVar1,sVar3,_Var4._M_p);
  }
  return;
}

Assistant:

void helicsCoreSetLogFile(HelicsCore core, const char* logFileName, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->setLogFile(AS_STRING_VIEW(logFileName));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}